

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

char * cppcms_capi_session_get(cppcms_capi_session *session,char *key)

{
  session_interface *psVar1;
  bool bVar2;
  allocator local_61;
  string local_60;
  string local_40;
  
  if (session != (cppcms_capi_session *)0x0) {
    anon_unknown.dwarf_329815::check_str(key);
    cppcms_capi_session::check_loaded(session);
    psVar1 = (session->p).ptr_;
    std::__cxx11::string::string((string *)&local_60,key,(allocator *)&local_40);
    bVar2 = cppcms::session_interface::is_set(psVar1,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar2) {
      psVar1 = (session->p).ptr_;
      std::__cxx11::string::string((string *)&local_40,key,&local_61);
      cppcms::session_interface::get(&local_60,psVar1,&local_40);
      std::__cxx11::string::operator=((string *)&session->returned_value,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      return (session->returned_value)._M_dataplus._M_p;
    }
  }
  return (char *)0x0;
}

Assistant:

char const *cppcms_capi_session_get(cppcms_capi_session *session,char const *key)
{
	TRY {
		if(!session)
			return 0;
		check_str(key);
		session->check_loaded();
		if(!session->p->is_set(key))
			return 0;
		session->returned_value = session->p->get(key);
		return session->returned_value.c_str();
	}